

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsFortran.cxx
# Opt level: O2

cmDependsFortranSourceInfo * __thiscall
cmDependsFortranInternals::CreateObjectInfo(cmDependsFortranInternals *this,char *obj,char *src)

{
  iterator iVar1;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsFortranSourceInfo>_>,_bool>
  pVar2;
  value_type entry;
  char *local_1a8;
  cmDependsFortranSourceInfo local_1a0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsFortranSourceInfo>
  local_f0;
  
  local_1a8 = obj;
  std::__cxx11::string::string((string *)&local_f0,obj,(allocator *)&local_1a0);
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsFortranSourceInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsFortranSourceInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsFortranSourceInfo>_>_>
          ::find(&(this->ObjectInfo)._M_t,&local_f0.first);
  std::__cxx11::string::~string((string *)&local_f0);
  if ((_Rb_tree_header *)iVar1._M_node == &(this->ObjectInfo)._M_t._M_impl.super__Rb_tree_header) {
    local_1a0.Source._M_dataplus._M_p = (pointer)&local_1a0.Source.field_2;
    local_1a0.Provides._M_t._M_impl._0_8_ = 0;
    local_1a0.Provides._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_1a0.Provides._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_1a0.Requires._M_t._M_impl._0_8_ = 0;
    local_1a0.Requires._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_1a0.Requires._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_1a0.Includes._M_t._M_impl._0_8_ = 0;
    local_1a0.Source.field_2._M_allocated_capacity = 0;
    local_1a0.Source.field_2._8_8_ = 0;
    local_1a0.Source._M_string_length = 0;
    local_1a0.Provides._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_1a0.Provides._M_t._M_impl.super__Rb_tree_header._M_header;
    local_1a0.Provides._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_1a0.Provides._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    local_1a0.Requires._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_1a0.Requires._M_t._M_impl.super__Rb_tree_header._M_header;
    local_1a0.Requires._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_1a0.Requires._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    local_1a0.Includes._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_1a0.Includes._M_t._M_impl.super__Rb_tree_header._M_header;
    local_1a0.Includes._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_1a0.Includes._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    local_1a0.Includes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_1a0.Includes._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_1a0.Provides._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_1a0.Provides._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_1a0.Requires._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_1a0.Requires._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_1a0.Includes._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_1a0.Includes._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsFortranSourceInfo>
    ::pair<const_char_*&,_cmDependsFortranSourceInfo,_true>(&local_f0,&local_1a8,&local_1a0);
    cmDependsFortranSourceInfo::~cmDependsFortranSourceInfo(&local_1a0);
    pVar2 = std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmDependsFortranSourceInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,cmDependsFortranSourceInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmDependsFortranSourceInfo>>>
            ::_M_emplace_unique<std::pair<std::__cxx11::string_const,cmDependsFortranSourceInfo>&>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmDependsFortranSourceInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,cmDependsFortranSourceInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmDependsFortranSourceInfo>>>
                        *)&this->ObjectInfo,&local_f0);
    iVar1._M_node = (_Base_ptr)pVar2.first._M_node;
    std::__cxx11::string::assign((char *)(iVar1._M_node + 2));
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsFortranSourceInfo>
    ::~pair(&local_f0);
  }
  return (cmDependsFortranSourceInfo *)(iVar1._M_node + 2);
}

Assistant:

cmDependsFortranSourceInfo& CreateObjectInfo(const char* obj,
                                               const char* src)
    {
    std::map<std::string, cmDependsFortranSourceInfo>::iterator i =
      this->ObjectInfo.find(obj);
    if(i == this->ObjectInfo.end())
      {
      std::map<std::string, cmDependsFortranSourceInfo>::value_type
        entry(obj, cmDependsFortranSourceInfo());
      i = this->ObjectInfo.insert(entry).first;
      i->second.Source = src;
      }
    return i->second;
    }